

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O2

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  uint *puVar1;
  dynbuf *s;
  char cVar2;
  int *piVar3;
  long lVar4;
  CURLcode CVar5;
  CURLofft CVar6;
  uint uVar7;
  curlfiletype cVar8;
  int iVar9;
  fileinfo *pfVar10;
  size_t sVar11;
  char *pcVar12;
  long lVar13;
  void *pvVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  size_t sStack_70;
  char c;
  ulong local_58;
  Curl_easy *local_50;
  char *p;
  char *local_40;
  curl_off_t fsize;
  
  uVar17 = size * nmemb;
  piVar3 = (int *)**(undefined8 **)(*(long *)((long)connptr + 0x1350) + 0x30);
  if (piVar3[3] != 0) {
LAB_004de6de:
    if (*(fileinfo **)(piVar3 + 4) != (fileinfo *)0x0) {
      Curl_fileinfo_cleanup(*(fileinfo **)(piVar3 + 4));
      piVar3[4] = 0;
      piVar3[5] = 0;
    }
    return uVar17;
  }
  if ((uVar17 != 0) && (*piVar3 == 0)) {
    *piVar3 = ((byte)(*buffer - 0x30U) < 10) + 1;
  }
  uVar15 = 0;
  local_58 = uVar17;
  local_50 = (Curl_easy *)connptr;
  local_40 = buffer;
LAB_004ddb0a:
  uVar17 = local_58;
  if (local_58 <= uVar15) {
    return local_58;
  }
  c = local_40[uVar15];
  pfVar10 = *(fileinfo **)(piVar3 + 4);
  if (pfVar10 == (fileinfo *)0x0) {
    pfVar10 = Curl_fileinfo_alloc();
    *(fileinfo **)(piVar3 + 4) = pfVar10;
    if (pfVar10 != (fileinfo *)0x0) {
      piVar3[8] = 0;
      piVar3[9] = 0;
      piVar3[6] = 0;
      Curl_dyn_init(&pfVar10->buf,10000);
      pfVar10 = *(fileinfo **)(piVar3 + 4);
      goto LAB_004ddb57;
    }
LAB_004de6b3:
    piVar3[3] = 0x1b;
    goto LAB_004de6de;
  }
LAB_004ddb57:
  s = &pfVar10->buf;
  CVar5 = Curl_dyn_addn(s,&c,1);
  if (CVar5 != CURLE_OK) goto LAB_004de6b3;
  sVar11 = Curl_dyn_len(s);
  pcVar12 = Curl_dyn_ptr(s);
  if (*piVar3 == 2) {
    switch(piVar3[1]) {
    case 0:
      uVar7 = piVar3[6] + 1;
      piVar3[6] = uVar7;
      if (uVar7 < 9) {
        pcVar12 = "0123456789-";
        sStack_70 = 0xc;
LAB_004de083:
        pvVar14 = memchr(pcVar12,(int)c,sStack_70);
        if (pvVar14 == (void *)0x0) goto LAB_004de6c7;
        break;
      }
      if ((uVar7 != 9) || (c != ' ')) {
LAB_004de6d6:
        piVar3[3] = 0x57;
        uVar17 = local_58;
        goto LAB_004de6de;
      }
      piVar3[1] = 1;
      piVar3[2] = 0;
      break;
    case 1:
      iVar9 = piVar3[6];
      piVar3[6] = iVar9 + 1U;
      if (piVar3[2] == 1) {
        if (c != ' ') {
          pcVar12 = "APM0123456789:";
          sStack_70 = 0xf;
          goto LAB_004de083;
        }
        *(long *)(piVar3 + 0x10) = *(long *)(piVar3 + 8);
        pcVar12[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
        piVar3[1] = 2;
        piVar3[2] = 0;
LAB_004de000:
        piVar3[6] = 0;
      }
      else if (((piVar3[2] == 0) && (c != '\t')) && (c != ' ')) {
LAB_004de3a3:
        piVar3[2] = 1;
      }
      break;
    case 2:
      iVar9 = piVar3[2];
      if (iVar9 != 1) goto LAB_004ddfae;
      iVar9 = piVar3[6];
      piVar3[6] = iVar9 + 1U;
      if (c == ' ') {
        pcVar12[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
        lVar13 = *(long *)(piVar3 + 8);
        iVar9 = strcmp("<DIR>",pcVar12 + lVar13);
        if (iVar9 == 0) {
          (pfVar10->info).filetype = CURLFILETYPE_DIRECTORY;
          (pfVar10->info).size = 0;
          lVar13 = *(long *)(piVar3 + 4);
        }
        else {
          CVar6 = curlx_strtoofft(pcVar12 + lVar13,&p,10,&(pfVar10->info).size);
          if (CVar6 != CURL_OFFT_OK) goto LAB_004de6c7;
          lVar13 = *(long *)(piVar3 + 4);
          *(undefined4 *)(lVar13 + 8) = 0;
        }
        *(byte *)(lVar13 + 0x60) = *(byte *)(lVar13 + 0x60) | 0x40;
LAB_004de65d:
        piVar3[6] = 0;
        piVar3[1] = 3;
        piVar3[2] = 0;
      }
      break;
    case 3:
      iVar9 = piVar3[2];
      if (iVar9 == 2) {
        if (c != '\n') goto LAB_004de6c7;
        *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
      }
      else {
        if (iVar9 != 1) goto LAB_004ddfae;
        piVar3[6] = piVar3[6] + 1;
        if (c != '\n') {
          if (c == '\r') {
            piVar3[2] = 2;
            pcVar12[sVar11 - 1] = '\0';
          }
          break;
        }
        *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
        pcVar12[sVar11 - 1] = '\0';
      }
      ftp_pl_insert_finfo(local_50,pfVar10);
      piVar3[1] = 0;
      piVar3[2] = 0;
    }
  }
  else {
    if (*piVar3 != 1) {
      uVar17 = local_58 + 1;
      goto LAB_004de6de;
    }
    switch(piVar3[1]) {
    case 0:
      if (piVar3[2] == 1) {
        uVar7 = piVar3[6];
        piVar3[6] = uVar7 + 1;
        if (c == '\n') {
          pcVar12[uVar7] = '\0';
          iVar9 = strncmp("total ",pcVar12,6);
          if (iVar9 == 0) {
            pcVar16 = pcVar12 + 7;
            for (pcVar12 = pcVar12 + 6; (cVar2 = *pcVar12, cVar2 == '\t' || (cVar2 == ' '));
                pcVar12 = pcVar12 + 1) {
              pcVar16 = pcVar16 + 1;
            }
            while ((byte)(cVar2 - 0x30U) < 10) {
              cVar2 = *pcVar16;
              pcVar16 = pcVar16 + 1;
            }
            if (cVar2 == '\0') {
              piVar3[1] = 1;
              Curl_dyn_reset(s);
              break;
            }
          }
          goto LAB_004de6c7;
        }
        if (c == '\r') {
          piVar3[6] = uVar7;
          Curl_dyn_setlen(s,sVar11 - 1);
        }
        break;
      }
      if (piVar3[2] != 0) break;
      if (c == 't') {
        piVar3[2] = 1;
        piVar3[6] = piVar3[6] + 1;
        break;
      }
      piVar3[1] = 1;
      Curl_dyn_reset(s);
      goto LAB_004ddb0a;
    case 1:
      if (c == '-') {
        cVar8 = CURLFILETYPE_FILE;
      }
      else if (c == 'D') {
        cVar8 = CURLFILETYPE_DOOR;
      }
      else if (c == 'b') {
        cVar8 = CURLFILETYPE_DEVICE_BLOCK;
      }
      else if (c == 'c') {
        cVar8 = CURLFILETYPE_DEVICE_CHAR;
      }
      else if (c == 's') {
        cVar8 = CURLFILETYPE_SOCKET;
      }
      else if (c == 'l') {
        cVar8 = CURLFILETYPE_SYMLINK;
      }
      else if (c == 'p') {
        cVar8 = CURLFILETYPE_NAMEDPIPE;
      }
      else {
        if (c != 'd') goto LAB_004de6c7;
        cVar8 = CURLFILETYPE_DIRECTORY;
      }
      (pfVar10->info).filetype = cVar8;
      piVar3[1] = 2;
      piVar3[6] = 0;
      piVar3[8] = 1;
      piVar3[9] = 0;
      break;
    case 2:
      uVar7 = piVar3[6] + 1;
      piVar3[6] = uVar7;
      if (uVar7 < 10) {
        pcVar12 = "rwx-tTsS";
        sStack_70 = 9;
        goto LAB_004de083;
      }
      if (uVar7 == 10) {
        if (c == ' ') {
          pcVar12[10] = '\0';
          lVar13 = *(long *)(piVar3 + 8);
          uVar7 = (uint)(pcVar12[lVar13] != '-') << 0x18;
          if (pcVar12[lVar13] == 'r') {
            uVar7 = 0x100;
          }
          if (pcVar12[lVar13 + 1] != '-') {
            if (pcVar12[lVar13 + 1] == 'w') {
              uVar7 = uVar7 | 0x80;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          cVar2 = pcVar12[lVar13 + 2];
          if (cVar2 != '-') {
            if (cVar2 == 'S') {
              uVar7 = uVar7 | 0x800;
            }
            else if (cVar2 == 's') {
              uVar7 = uVar7 | 0x840;
            }
            else if (cVar2 == 'x') {
              uVar7 = uVar7 | 0x40;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          if (pcVar12[lVar13 + 3] != '-') {
            if (pcVar12[lVar13 + 3] == 'r') {
              uVar7 = uVar7 | 0x20;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          if (pcVar12[lVar13 + 4] != '-') {
            if (pcVar12[lVar13 + 4] == 'w') {
              uVar7 = uVar7 | 0x10;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          cVar2 = pcVar12[lVar13 + 5];
          if (cVar2 != '-') {
            if (cVar2 == 'S') {
              uVar7 = uVar7 | 0x400;
            }
            else if (cVar2 == 's') {
              uVar7 = uVar7 | 0x408;
            }
            else if (cVar2 == 'x') {
              uVar7 = uVar7 | 8;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          if (pcVar12[lVar13 + 6] != '-') {
            if (pcVar12[lVar13 + 6] == 'r') {
              uVar7 = uVar7 | 4;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          if (pcVar12[lVar13 + 7] != '-') {
            if (pcVar12[lVar13 + 7] == 'w') {
              uVar7 = uVar7 | 2;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          cVar2 = pcVar12[lVar13 + 8];
          if (cVar2 != '-') {
            if (cVar2 == 'T') {
              uVar7 = uVar7 | 0x200;
            }
            else if (cVar2 == 't') {
              uVar7 = uVar7 | 0x201;
            }
            else {
              if (cVar2 != 'x') goto LAB_004de6d6;
              uVar7 = uVar7 | 1;
            }
          }
          if (0xffffff < uVar7) goto LAB_004de6d6;
          lVar4 = *(long *)(piVar3 + 4);
          puVar1 = (uint *)(lVar4 + 0x60);
          *puVar1 = *puVar1 | 8;
          *(uint *)(lVar4 + 0x18) = uVar7;
          *(long *)(piVar3 + 0x12) = lVar13;
          goto LAB_004de65d;
        }
        goto LAB_004de6c7;
      }
      break;
    case 3:
      iVar9 = piVar3[2];
      if (iVar9 == 1) {
        iVar9 = piVar3[6];
        piVar3[6] = iVar9 + 1U;
        if (c == ' ') {
          pcVar12[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
          lVar13 = strtol(pcVar12 + *(long *)(piVar3 + 8),&p,10);
          if ((*p == '\0') && (lVar13 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
            lVar4 = *(long *)(piVar3 + 4);
            puVar1 = (uint *)(lVar4 + 0x60);
            *puVar1 = *puVar1 | 0x80;
            *(long *)(lVar4 + 0x30) = lVar13;
          }
          piVar3[6] = 0;
          piVar3[8] = 0;
          piVar3[9] = 0;
          piVar3[1] = 4;
          piVar3[2] = 0;
        }
        else {
LAB_004de160:
          if (9 < (byte)(c - 0x30U)) goto LAB_004de6c7;
        }
      }
      else {
LAB_004ddf79:
        if ((iVar9 == 0) && (c != ' ')) {
          if ((byte)(c - 0x30U) < 10) goto LAB_004ddfc1;
          goto LAB_004de6c7;
        }
      }
      break;
    case 4:
      iVar9 = piVar3[2];
      if (iVar9 == 1) {
        iVar9 = piVar3[6];
        piVar3[6] = iVar9 + 1U;
        if (c == ' ') {
          pcVar12[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 0xc) = *(undefined8 *)(piVar3 + 8);
          piVar3[1] = 5;
          piVar3[2] = 0;
LAB_004ddf62:
          piVar3[8] = 0;
          piVar3[9] = 0;
          goto LAB_004de000;
        }
      }
      else {
LAB_004ddfae:
        if (iVar9 == 0) goto switchD_004dddb1_caseD_0;
      }
      break;
    case 5:
      iVar9 = piVar3[2];
      if (iVar9 != 1) goto LAB_004ddfae;
      iVar9 = piVar3[6];
      piVar3[6] = iVar9 + 1U;
      if (c == ' ') {
        pcVar12[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
        *(undefined8 *)(piVar3 + 0xe) = *(undefined8 *)(piVar3 + 8);
        piVar3[1] = 6;
        piVar3[2] = 0;
        goto LAB_004ddf62;
      }
      break;
    case 6:
      iVar9 = piVar3[2];
      if (iVar9 != 1) goto LAB_004ddf79;
      iVar9 = piVar3[6];
      piVar3[6] = iVar9 + 1U;
      if (c != ' ') goto LAB_004de160;
      pcVar12[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
      CVar6 = curlx_strtoofft(pcVar12 + *(long *)(piVar3 + 8),&p,10,&fsize);
      if (CVar6 == CURL_OFFT_OK) {
        if (fsize + 0x7fffffffffffffffU < 0xfffffffffffffffe && *p == '\0') {
          lVar13 = *(long *)(piVar3 + 4);
          puVar1 = (uint *)(lVar13 + 0x60);
          *puVar1 = *puVar1 | 0x40;
          *(curl_off_t *)(lVar13 + 0x28) = fsize;
        }
        piVar3[6] = 0;
        piVar3[8] = 0;
        piVar3[9] = 0;
        piVar3[1] = 7;
        piVar3[2] = 0;
      }
      break;
    case 7:
      switch(piVar3[2]) {
      case 0:
        if (c != ' ') {
          if ((9 < (byte)(c - 0x30U)) && (0x19 < (byte)((c & 0xdfU) + 0xbf))) goto LAB_004de6c7;
          goto LAB_004ddfc1;
        }
        break;
      case 1:
        piVar3[6] = piVar3[6] + 1;
        if (c == ' ') {
LAB_004de260:
          piVar3[2] = 2;
        }
        else {
LAB_004de26d:
          if ((0x19 < (byte)(c + 0x9fU) && 9 < (byte)(c - 0x30U)) &&
             (c != '.' && (byte)(c + 0xa5U) < 0xe6)) goto LAB_004de6c7;
        }
        break;
      case 2:
        piVar3[6] = piVar3[6] + 1;
        if (c != ' ') {
          if (((byte)(c - 0x30U) < 10) || ((byte)((c & 0xdfU) + 0xbf) < 0x1a)) goto LAB_004de376;
          goto LAB_004de6c7;
        }
        break;
      case 3:
        piVar3[6] = piVar3[6] + 1;
        if (c != ' ') goto LAB_004de26d;
LAB_004de3b0:
        piVar3[2] = 4;
        break;
      case 4:
        piVar3[6] = piVar3[6] + 1;
        if (c != ' ') {
          if ((9 < (byte)(c - 0x30U)) && (0x19 < (byte)((c & 0xdfU) + 0xbf))) goto LAB_004de6c7;
          piVar3[2] = 5;
        }
        break;
      case 5:
        iVar9 = piVar3[6];
        piVar3[6] = iVar9 + 1U;
        if (c == ' ') {
          pcVar12[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 0x10) = *(undefined8 *)(piVar3 + 8);
          if ((pfVar10->info).filetype == CURLFILETYPE_SYMLINK) {
            piVar3[1] = 9;
            piVar3[2] = 0;
          }
          else {
            piVar3[1] = 8;
            piVar3[2] = 0;
          }
        }
        else if (((((byte)(c - 0x3aU) < 0xf6) && ((byte)((c & 0xdfU) + 0xa5) < 0xe6)) && (c != '.'))
                && (c != ':')) goto LAB_004de6c7;
      }
      break;
    case 8:
      iVar9 = piVar3[2];
      if (iVar9 == 2) {
        if (c != '\n') goto LAB_004de6c7;
        uVar7 = piVar3[6];
      }
      else {
        if (iVar9 != 1) goto LAB_004ddfae;
        uVar7 = piVar3[6] + 1;
        piVar3[6] = uVar7;
        if (c != '\n') {
          if (c == '\r') goto LAB_004de260;
          break;
        }
      }
      pcVar12[((ulong)uVar7 - 1) + *(long *)(piVar3 + 8)] = '\0';
      *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
      piVar3[1] = 1;
      ftp_pl_insert_finfo(local_50,pfVar10);
      break;
    case 9:
      switch(piVar3[2]) {
      case 0:
switchD_004dddb1_caseD_0:
        if (c != ' ') {
LAB_004ddfc1:
          *(size_t *)(piVar3 + 8) = sVar11 - 1;
          piVar3[6] = 1;
          piVar3[2] = 1;
        }
        break;
      case 1:
        piVar3[6] = piVar3[6] + 1;
        if (c == ' ') goto LAB_004de260;
        if ((c == '\n') || (c == '\r')) goto LAB_004de6c7;
        break;
      case 2:
        piVar3[6] = piVar3[6] + 1;
        if (c != '-') goto LAB_004de391;
LAB_004de376:
        piVar3[2] = 3;
        break;
      case 3:
        piVar3[6] = piVar3[6] + 1;
        if (c == '>') goto LAB_004de3b0;
LAB_004de391:
        if (c != '\n') {
joined_r0x004de361:
          if (c != '\r') goto LAB_004de3a3;
        }
        goto LAB_004de6c7;
      case 4:
        iVar9 = piVar3[6];
        piVar3[6] = iVar9 + 1U;
        if (c != ' ') {
          if (c == '\n') goto LAB_004de6c7;
          goto joined_r0x004de361;
        }
        piVar3[2] = 5;
        pcVar12[((ulong)(iVar9 + 1U) - 4) + *(long *)(piVar3 + 8)] = '\0';
        *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
        piVar3[6] = 0;
        piVar3[8] = 0;
        piVar3[9] = 0;
        break;
      case 5:
        if ((c == '\n') || (c == '\r')) goto LAB_004de6c7;
        piVar3[2] = 6;
        *(size_t *)(piVar3 + 8) = sVar11 - 1;
        piVar3[6] = 1;
        break;
      case 6:
        uVar7 = piVar3[6] + 1;
        piVar3[6] = uVar7;
        if (c == '\n') {
LAB_004de67e:
          pcVar12[((ulong)uVar7 - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 0x14) = *(undefined8 *)(piVar3 + 8);
          ftp_pl_insert_finfo(local_50,pfVar10);
          piVar3[1] = 1;
        }
        else if (c == '\r') {
          piVar3[2] = 7;
        }
        break;
      case 7:
        if (c == '\n') {
          uVar7 = piVar3[6];
          goto LAB_004de67e;
        }
LAB_004de6c7:
        piVar3[3] = 0x57;
        uVar17 = local_58;
        goto LAB_004de6de;
      }
    }
  }
  uVar15 = uVar15 + 1;
  goto LAB_004ddb0a;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct Curl_easy *data = (struct Curl_easy *)connptr;
  struct ftp_wc *ftpwc = data->wildcard->ftpwc;
  struct ftp_parselist_data *parser = ftpwc->parser;
  size_t i = 0;
  CURLcode result;
  size_t retsize = bufflen;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is handled later
     *    in wc_statemach()
     */
    goto fail;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = ISDIGIT(buffer[0]) ? OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */
    char *mem;
    size_t len; /* number of bytes of data in the dynbuf */
    char c = buffer[i];
    struct fileinfo *infop;
    struct curl_fileinfo *finfo;
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->item_offset = 0;
      parser->item_length = 0;
      Curl_dyn_init(&parser->file_data->buf, MAX_FTPLIST_BUFFER);
    }

    infop = parser->file_data;
    finfo = &infop->info;

    if(Curl_dyn_addn(&infop->buf, &c, 1)) {
      parser->error = CURLE_OUT_OF_MEMORY;
      goto fail;
    }
    len = Curl_dyn_len(&infop->buf);
    mem = Curl_dyn_ptr(&infop->buf);

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            Curl_dyn_reset(&infop->buf);
            continue;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            Curl_dyn_setlen(&infop->buf, --len);
          }
          else if(c == '\n') {
            mem[parser->item_length - 1] = 0;
            if(!strncmp("total ", mem, 6)) {
              char *endptr = mem + 6;
              /* here we can deal with directory size, pass the leading
                 whitespace and then the digits */
              while(ISBLANK(*endptr))
                endptr++;
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              Curl_dyn_reset(&infop->buf);
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          mem[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(mem + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            mem[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(mem + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(!curlx_strtoofft(mem + parser->item_offset,
                                &p, 10, &fsize)) {
              if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                 fsize != CURL_OFF_T_MIN) {
                parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
                parser->file_data->info.size = fsize;
              }
              parser->item_length = 0;
              parser->item_offset = 0;
              parser->state.UNIX.main = PL_UNIX_TIME;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
            }
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = len -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->mem + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            mem[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = len - 1;
            parser->item_length = 1;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else {
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISBLANK(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", mem + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              if(curlx_strtoofft(mem +
                                 parser->item_offset,
                                 &endptr, 10, &finfo->size)) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            mem[len - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            mem[len - 1] = 0;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    default:
      retsize = bufflen + 1;
      goto fail;
    }

    i++;
  }
  return retsize;

fail:

  /* Clean up any allocated memory. */
  if(parser->file_data) {
    Curl_fileinfo_cleanup(parser->file_data);
    parser->file_data = NULL;
  }

  return retsize;
}